

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RuntimeCharTrie::Match
          (RuntimeCharTrie *this,Char *input,CharCount inputLength,CharCount *inputOffset,
          RegexStats *stats)

{
  Char CVar1;
  Char CVar2;
  int iVar3;
  uint uVar4;
  RuntimeCharTrieEntry *pRVar5;
  RuntimeCharTrie *pRVar6;
  int iVar7;
  
  do {
    iVar3 = this->count;
    if (iVar3 == 0) break;
    uVar4 = *inputOffset;
    if (inputLength <= uVar4) break;
    if (stats != (RegexStats *)0x0) {
      stats->numCompares = stats->numCompares + 1;
    }
    pRVar5 = this->children;
    CVar1 = input[uVar4];
    iVar7 = 1;
    do {
      pRVar6 = &pRVar5->node;
      CVar2 = *(Char *)((long)(pRVar6 + -1) + 8);
      if (CVar2 == CVar1) {
        *inputOffset = uVar4 + 1;
        this = pRVar6;
        break;
      }
      if (iVar3 <= iVar7) break;
      pRVar5 = (RuntimeCharTrieEntry *)(pRVar6 + 1);
      iVar7 = iVar7 + 1;
    } while ((ushort)CVar2 <= (ushort)CVar1);
  } while (CVar2 == CVar1);
  return iVar3 == 0;
}

Assistant:

bool RuntimeCharTrie::Match
        (const Char* const input
            , const CharCount inputLength
            , CharCount& inputOffset
#if ENABLE_REGEX_CONFIG_OPTIONS
            , RegexStats* stats
#endif
            ) const
    {
        const RuntimeCharTrie* curr = this;
        while (true)
        {
            if (curr->count == 0)
                return true;
            if (inputOffset >= inputLength)
                return false;
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif

#if 0
            int l = 0;
            int h = curr->count - 1;
            while (true)
            {
                if (l > h)
                    return false;
                int m = (l + h) / 2;
                if (curr->children[m].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[m].node;
                    break;
                }
                else if (CTU(curr->children[m].c) < CTU(input[inputOffset]))
                    l = m + 1;
                else
                    h = m - 1;
            }
#else
            int i = 0;
            while (true)
            {
                if (curr->children[i].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[i].node;
                    break;
                }
                else if (curr->children[i].c > input[inputOffset])
                    return false;
                else if (++i >= curr->count)
                    return false;
            }
#endif
        }
    }